

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_DirectMSFStream.cpp
# Opt level: O0

void __thiscall
PDB::DirectMSFStream::ReadAtOffset
          (DirectMSFStream *this,void *destination,size_t size,size_t offset)

{
  uint uVar1;
  uint32_t uVar2;
  void *pvVar3;
  void *__src;
  ulong uVar4;
  unsigned_long howManyBytes;
  void *sourceData_2;
  void *destinationData;
  size_t bytesLeftToRead;
  void *sourceData_1;
  void *sourceData;
  size_t bytesLeftInBlock;
  size_t offsetWithinData;
  size_t offsetWithinBlock;
  size_t blockIndex;
  size_t offset_local;
  size_t size_local;
  void *destination_local;
  DirectMSFStream *this_local;
  
  offsetWithinBlock = offset >> ((byte)this->m_blockSizeLog2 & 0x3f);
  uVar4 = offset & this->m_blockSize - 1;
  howManyBytes = ((ulong)this->m_blockIndices[offsetWithinBlock] <<
                 ((byte)this->m_blockSizeLog2 & 0x3f)) + uVar4;
  uVar4 = this->m_blockSize - uVar4;
  if (uVar4 < size) {
    pvVar3 = Pointer::Offset<void_const*,void_const,unsigned_long>(this->m_data,howManyBytes);
    memcpy(destination,pvVar3,uVar4);
    destinationData = (void *)(size - uVar4);
    while (destinationData != (void *)0x0) {
      offsetWithinBlock = offsetWithinBlock + 1;
      uVar1 = this->m_blockIndices[offsetWithinBlock];
      uVar2 = this->m_blockSizeLog2;
      pvVar3 = Pointer::Offset<void*,void,unsigned_long>(destination,size - (long)destinationData);
      __src = Pointer::Offset<void_const*,void_const,unsigned_long>
                        (this->m_data,(ulong)uVar1 << ((byte)uVar2 & 0x3f));
      if ((void *)(ulong)this->m_blockSize < destinationData) {
        memcpy(pvVar3,__src,(ulong)this->m_blockSize);
        destinationData = (void *)((long)destinationData - (ulong)this->m_blockSize);
      }
      else {
        memcpy(pvVar3,__src,(size_t)destinationData);
        destinationData = (void *)0x0;
      }
    }
  }
  else {
    pvVar3 = Pointer::Offset<void_const*,void_const,unsigned_long>(this->m_data,howManyBytes);
    memcpy(destination,pvVar3,size);
  }
  return;
}

Assistant:

void PDB::DirectMSFStream::ReadAtOffset(void* destination, size_t size, size_t offset) const PDB_NO_EXCEPT
{
	PDB_ASSERT(destination != nullptr, "Destination buffer not set");
	PDB_ASSERT(offset + size <= m_size, "Not enough data left to read.");

	// work out which block and offset within the block the read offset corresponds to
	size_t blockIndex = offset >> m_blockSizeLog2;
	const size_t offsetWithinBlock = offset & (m_blockSize - 1u);

	// work out the offset within the data based on the block indices
	size_t offsetWithinData = (static_cast<size_t>(m_blockIndices[blockIndex]) << m_blockSizeLog2) + offsetWithinBlock;
	const size_t bytesLeftInBlock = m_blockSize - offsetWithinBlock;

	if (bytesLeftInBlock >= size)
	{
		// fast path, all the data can be read in one go
		const void* const sourceData = Pointer::Offset<const void*>(m_data, offsetWithinData);
		std::memcpy(destination, sourceData, size);
	}
	else
	{
		// slower path, data is scattered across several blocks.
		// read remaining bytes in current block first.
		{
			const void* const sourceData = Pointer::Offset<const void*>(m_data, offsetWithinData);
			std::memcpy(destination, sourceData, bytesLeftInBlock);
		}

		// read remaining bytes from blocks
		size_t bytesLeftToRead = size - bytesLeftInBlock;
		while (bytesLeftToRead != 0u)
		{
			// advance to the next block
			++blockIndex;
			offsetWithinData = static_cast<size_t>(m_blockIndices[blockIndex]) << m_blockSizeLog2;

			void* const destinationData = Pointer::Offset<void*>(destination, size - bytesLeftToRead);
			const void* const sourceData = Pointer::Offset<const void*>(m_data, offsetWithinData);

			if (bytesLeftToRead > m_blockSize)
			{
				// copy a whole block at once
				std::memcpy(destinationData, sourceData, m_blockSize);
				bytesLeftToRead -= m_blockSize;
			}
			else
			{
				// copy remaining bytes
				std::memcpy(destinationData, sourceData, bytesLeftToRead);
				bytesLeftToRead -= bytesLeftToRead;
			}
		}
	}
}